

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

bool djgb_to_gl(djg_buffer *buffer,void *data,int *offset)

{
  int iVar1;
  void *__dest;
  GLint buf;
  GLuint local_2c;
  
  local_2c = 0;
  (*glad_glGetIntegerv)(0x8894,(GLint *)&local_2c);
  if (buffer->capacity < buffer->size + buffer->offset) {
    buffer->offset = 0;
    fwrite("djg_info: buffer orphaned\n",0x1a,1,_stdout);
    fflush(_stdout);
  }
  (*glad_glBindBuffer)(0x8892,buffer->gl);
  __dest = (*glad_glMapBufferRange)(0x8892,(long)buffer->offset,(long)buffer->size,0x22);
  if (__dest == (void *)0x0) {
    fwrite("djg_error: Buffer mapping failed\n",0x21,1,_stdout);
    fflush(_stdout);
  }
  else {
    memcpy(__dest,data,(long)buffer->size);
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glBindBuffer)(0x8892,local_2c);
    iVar1 = buffer->offset;
    if (offset != (int *)0x0) {
      *offset = iVar1;
    }
    buffer->offset = iVar1 + buffer->size;
  }
  return __dest != (void *)0x0;
}

Assistant:

DJGDEF bool djgb_to_gl(djg_buffer *buffer, const void *data, int *offset)
{
    GLint buf = 0;
    void *ptr = NULL;

    // save GL state
    glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &buf);

    // orphaning
    if (buffer->offset + buffer->size > buffer->capacity) {
        buffer->offset = 0;
        DJG_LOG("djg_info: buffer orphaned\n");
    }

    // stream data asynchronously
    glBindBuffer(GL_ARRAY_BUFFER, buffer->gl);
    ptr = glMapBufferRange(
        GL_ARRAY_BUFFER,
        buffer->offset,
        buffer->size,
        GL_MAP_WRITE_BIT | GL_MAP_UNSYNCHRONIZED_BIT
    );
    if (!ptr) {
        DJG_LOG("djg_error: Buffer mapping failed\n");

        return false;
    }
    memcpy(ptr, data, buffer->size);
    glUnmapBuffer(GL_ARRAY_BUFFER);
    glBindBuffer(GL_ARRAY_BUFFER, buf);

    // update buffer offset
    if (offset) (*offset) = buffer->offset;
    buffer->offset+= buffer->size;

    return true;
}